

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O2

SColor __thiscall irr::video::SColorf::toSColor(SColorf *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = floorf((float)this->a * 255.0 + 0.5);
  fVar4 = floorf((float)this->b * 255.0 + 0.5);
  uVar1 = this->r;
  uVar2 = this->g;
  fVar5 = floorf((float)uVar1 * 255.0 + 0.5);
  fVar6 = floorf((float)uVar2 * 255.0 + 0.5);
  return (SColor)((int)fVar4 & 0xffU |
                 (int)fVar6 * 0x100 & 0xff00U | ((int)fVar5 & 0xffU) << 0x10 | (int)fVar3 << 0x18);
}

Assistant:

SColor toSColor() const
	{
		return SColor((u32)core::round32(a * 255.0f), (u32)core::round32(r * 255.0f), (u32)core::round32(g * 255.0f), (u32)core::round32(b * 255.0f));
	}